

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

void anon_unknown.dwarf_5b3ec2::ProcRand(uchar *out,int num,RNGLevel level,bool always_use_real_rng)

{
  uint64_t uVar1;
  bool bVar2;
  RNGState *this;
  ulong uVar3;
  Logger *pLVar4;
  int iVar5;
  int iVar6;
  int i;
  int iVar7;
  long in_FS_OFFSET;
  char cVar8;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  uint64_t out_1;
  CSHA512 startup_hasher;
  CSHA512 hasher;
  char *in_stack_fffffffffffffe20;
  unsigned_long *in_stack_fffffffffffffe28;
  unsigned_long *args;
  ulong local_1d0;
  CSHA512 local_1c8;
  CSHA512 local_100;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = GetRNGState();
  if (0x20 < num) {
    __assert_fail("num <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/random.cpp"
                  ,0x282,
                  "void (anonymous namespace)::ProcRand(unsigned char *, int, RNGLevel, bool)");
  }
  CSHA512::CSHA512(&local_100);
  if (level == PERIODIC) {
    SeedFast(&local_100);
    SeedTimestamp(&local_100);
    RNGState::SeedEvents(this,&local_100);
    uVar1 = local_100.bytes;
    RandAddDynamicEnv(&local_100);
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar4,RAND,Debug);
    if (bVar2) {
      local_1c8.s[0] = local_100.bytes - uVar1;
      logging_function._M_str = "SeedPeriodic";
      logging_function._M_len = 0xc;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/random.cpp";
      source_file._M_len = 0x53;
      LogPrintf_<unsigned_long>
                (logging_function,source_file,0x25d,
                 VALIDATION|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|CMPCTBLOCK|ADDRMAN|WALLETDB|ZMQ|
                 HTTP|MEMPOOL|TOR,(Level)&local_1c8,in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe28);
    }
    SeedStrengthen(&local_100,this,(duration)0x989680);
  }
  else if (level == SLOW) {
    SeedSlow(&local_100,this);
  }
  else {
    SeedFast(&local_100);
  }
  bVar2 = RNGState::MixExtract(this,out,(long)num,&local_100,false,always_use_real_rng);
  if (!bVar2) {
    CSHA512::CSHA512(&local_1c8);
    if ((anonymous_namespace)::g_rdseed_supported == '\x01') {
      iVar7 = 0;
      do {
        local_1d0 = rdseed();
        cVar8 = rdseedIsValid();
        while (cVar8 == '\0') {
          local_1d0 = rdseed();
          cVar8 = rdseedIsValid();
        }
        CSHA512::Write(&local_1c8,(uchar *)&local_1d0,8);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 4);
    }
    else if ((anonymous_namespace)::g_rdrand_supported == '\x01') {
      iVar7 = 0;
      do {
        local_1d0 = 0;
        iVar5 = 0;
        do {
          iVar6 = 9;
          do {
            uVar3 = rdrand();
            cVar8 = rdrandIsValid();
            bVar2 = iVar6 != 0;
            iVar6 = iVar6 + -1;
            if (cVar8 != '\0') break;
          } while (bVar2);
          local_1d0 = local_1d0 ^ uVar3;
          iVar5 = iVar5 + 1;
        } while (iVar5 != 0x400);
        CSHA512::Write(&local_1c8,(uchar *)&local_1d0,8);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 4);
    }
    SeedSlow(&local_1c8,this);
    uVar1 = local_1c8.bytes;
    RandAddDynamicEnv(&local_1c8);
    args = (unsigned_long *)out;
    RandAddStaticEnv(&local_1c8);
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar4,RAND,Debug);
    if (bVar2) {
      local_1d0 = local_1c8.bytes - uVar1;
      logging_function_00._M_str = "SeedStartup";
      logging_function_00._M_len = 0xb;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/random.cpp";
      source_file_00._M_len = 0x53;
      LogPrintf_<unsigned_long>
                (logging_function_00,source_file_00,0x271,
                 VALIDATION|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|CMPCTBLOCK|ADDRMAN|RPC|ZMQ|BENCH|
                 NET,(Level)&local_1d0,in_stack_fffffffffffffe20,args);
    }
    SeedStrengthen(&local_1c8,this,(duration)0x5f5e100);
    RNGState::MixExtract(this,out,(long)num,&local_1c8,true,always_use_real_rng);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProcRand(unsigned char* out, int num, RNGLevel level, bool always_use_real_rng) noexcept
{
    // Make sure the RNG is initialized first (as all Seed* function possibly need hwrand to be available).
    RNGState& rng = GetRNGState();

    assert(num <= 32);

    CSHA512 hasher;
    switch (level) {
    case RNGLevel::FAST:
        SeedFast(hasher);
        break;
    case RNGLevel::SLOW:
        SeedSlow(hasher, rng);
        break;
    case RNGLevel::PERIODIC:
        SeedPeriodic(hasher, rng);
        break;
    }

    // Combine with and update state
    if (!rng.MixExtract(out, num, std::move(hasher), false, always_use_real_rng)) {
        // On the first invocation, also seed with SeedStartup().
        CSHA512 startup_hasher;
        SeedStartup(startup_hasher, rng);
        rng.MixExtract(out, num, std::move(startup_hasher), true, always_use_real_rng);
    }
}